

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void set_default_options(superlu_options_t *options)

{
  options->Fact = DOFACT;
  options->Equil = YES;
  options->ColPerm = COLAMD;
  options->Trans = NOTRANS;
  options->IterRefine = NOREFINE;
  options->DiagPivotThresh = 1.0;
  options->SymmetricMode = NO;
  options->PivotGrowth = NO;
  options->ConditionNumber = NO;
  options->PrintStat = YES;
  return;
}

Assistant:

void set_default_options(superlu_options_t *options)
{
    options->Fact = DOFACT;
    options->Equil = YES;
    options->ColPerm = COLAMD;
    options->Trans = NOTRANS;
    options->IterRefine = NOREFINE;
    options->DiagPivotThresh = 1.0;
    options->SymmetricMode = NO;
    options->PivotGrowth = NO;
    options->ConditionNumber = NO;
    options->PrintStat = YES;
}